

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O0

ALLEGRO_CONFIG_SECTION * config_add_section(ALLEGRO_CONFIG *config,ALLEGRO_USTR *name)

{
  ALLEGRO_CONFIG_SECTION *compare;
  ALLEGRO_USTR *pAVar1;
  Aatree *pAVar2;
  void *in_RSI;
  Aatree *in_RDI;
  ALLEGRO_CONFIG_SECTION *section;
  ALLEGRO_CONFIG_SECTION *sec;
  ALLEGRO_USTR *in_stack_ffffffffffffffd8;
  ALLEGRO_CONFIG *config_00;
  size_t in_stack_fffffffffffffff8;
  
  config_00 = *(ALLEGRO_CONFIG **)in_RDI;
  compare = find_section(config_00,in_stack_ffffffffffffffd8);
  if (compare == (ALLEGRO_CONFIG_SECTION *)0x0) {
    compare = (ALLEGRO_CONFIG_SECTION *)
              al_calloc_with_context
                        (in_stack_fffffffffffffff8,(size_t)in_RDI,(int)((ulong)in_RSI >> 0x20),
                         (char *)config_00,(char *)0x0);
    pAVar1 = al_ustr_dup((ALLEGRO_USTR *)0x14b362);
    compare->name = pAVar1;
    if (config_00 == (ALLEGRO_CONFIG *)0x0) {
      *(ALLEGRO_CONFIG_SECTION **)in_RDI = compare;
      in_RDI->left = (Aatree *)compare;
    }
    else {
      *(ALLEGRO_CONFIG_SECTION **)(in_RDI->left + 1) = compare;
      compare->prev = (ALLEGRO_CONFIG_SECTION *)in_RDI->left;
      in_RDI->left = (Aatree *)compare;
    }
    pAVar2 = _al_aa_insert(in_RDI,in_RSI,config_00,(_al_cmp_t)compare);
    in_RDI->right = pAVar2;
  }
  return compare;
}

Assistant:

static ALLEGRO_CONFIG_SECTION *config_add_section(ALLEGRO_CONFIG *config,
   const ALLEGRO_USTR *name)
{
   ALLEGRO_CONFIG_SECTION *sec = config->head;
   ALLEGRO_CONFIG_SECTION *section;

   if ((section = find_section(config, name)))
      return section;

   section = al_calloc(1, sizeof(ALLEGRO_CONFIG_SECTION));
   section->name = al_ustr_dup(name);

   if (sec == NULL) {
      config->head = section;
      config->last = section;
   }
   else {
      ASSERT(config->last->next == NULL);
      config->last->next = section;
      section->prev = config->last;
      config->last = section;
   }

   config->tree = _al_aa_insert(config->tree, section->name, section, cmp_ustr);

   return section;
}